

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_Pred2_Test::iu_SyntaxTest_x_iutest_x_Pred2_Test
          (iu_SyntaxTest_x_iutest_x_Pred2_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00395238;
  return;
}

Assistant:

IUTEST(SyntaxTest, Pred2)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED2(IsGreater, 3, x) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED2(IsGreater, 3, x) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED2(IsGreater, 3, x) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED2(IsGreater, 3, x) << x;
}